

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcpclient.cpp
# Opt level: O2

void uv::TCPClient::ReconnectTimer(uv_timer_t *handle)

{
  char *pcVar1;
  void *pvVar2;
  char *pcVar3;
  long lVar4;
  int iVar5;
  CStringStream *pCVar6;
  ILog4zManager *pIVar7;
  long *in_FS_OFFSET;
  CStringStream ss;
  CStringStream ss_2;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  pvVar2 = handle->data;
  if (*(char *)((long)pvVar2 + 0x588) != '\x01') {
    return;
  }
  pcVar3 = (char *)*in_FS_OFFSET;
  pcVar1 = pcVar3 + -0x800;
  ss.m_pBegin = pcVar1;
  ss.m_pEnd = pcVar3;
  ss.m_pCur = pcVar1;
  zsummer::log4z::CStringStream::operator<<(&ss,"start reconnect...\n");
  pCVar6 = zsummer::log4z::CStringStream::operator<<(&ss," ( ");
  pCVar6 = zsummer::log4z::CStringStream::operator<<(pCVar6," ");
  pCVar6 = zsummer::log4z::CStringStream::operator<<(pCVar6," ) : ");
  zsummer::log4z::CStringStream::operator<<(pCVar6,0x20e);
  pIVar7 = zsummer::log4z::ILog4zManager::GetInstance();
  (*pIVar7->_vptr_ILog4zManager[8])(pIVar7,0,1,pcVar1);
  iVar5 = uv_tcp_init((long)pvVar2 + 0x90,*(undefined8 *)((long)pvVar2 + 8));
  if (iVar5 != 0) {
    ss.m_pBegin = pcVar1;
    ss.m_pEnd = pcVar3;
    ss.m_pCur = pcVar1;
    GetUVError_abi_cxx11_(&local_48,iVar5);
    zsummer::log4z::CStringStream::operator<<(&ss,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    pCVar6 = zsummer::log4z::CStringStream::operator<<(&ss," ( ");
    pCVar6 = zsummer::log4z::CStringStream::operator<<(pCVar6," ");
    pCVar6 = zsummer::log4z::CStringStream::operator<<(pCVar6," ) : ");
    zsummer::log4z::CStringStream::operator<<(pCVar6,0x212);
    pIVar7 = zsummer::log4z::ILog4zManager::GetInstance();
    (*pIVar7->_vptr_ILog4zManager[8])(pIVar7,0,3,pcVar1);
    goto LAB_0011803a;
  }
  lVar4 = *(long *)((long)pvVar2 + 8);
  *(long *)lVar4 = lVar4;
  *(void **)(lVar4 + 0x1d8) = pvVar2;
  if (*(char *)((long)pvVar2 + 0x5bc) == '\x01') {
    pCVar6 = &ss;
    iVar5 = uv_ip6_addr(*(undefined8 *)((long)pvVar2 + 0x598),*(undefined4 *)((long)pvVar2 + 0x5b8),
                        pCVar6);
    if (iVar5 == 0) {
LAB_00117f86:
      iVar5 = uv_tcp_connect((long)pvVar2 + 0x3f0,*(undefined8 *)((long)pvVar2 + 8),pCVar6,
                             AfterConnect);
      if (iVar5 == 0) {
        return;
      }
      ss.m_pBegin = pcVar1;
      ss.m_pEnd = pcVar3;
      ss.m_pCur = pcVar1;
      GetUVError_abi_cxx11_(&local_a8,iVar5);
      zsummer::log4z::CStringStream::operator<<(&ss,&local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
      pCVar6 = zsummer::log4z::CStringStream::operator<<(&ss," ( ");
      pCVar6 = zsummer::log4z::CStringStream::operator<<(pCVar6," ");
      pCVar6 = zsummer::log4z::CStringStream::operator<<(pCVar6," ) : ");
      iVar5 = 0x22d;
    }
    else {
      ss_2.m_pBegin = pcVar1;
      ss_2.m_pEnd = pcVar3;
      ss_2.m_pCur = pcVar1;
      GetUVError_abi_cxx11_(&local_68,iVar5);
      zsummer::log4z::CStringStream::operator<<(&ss_2,&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      pCVar6 = zsummer::log4z::CStringStream::operator<<(&ss_2," ( ");
      pCVar6 = zsummer::log4z::CStringStream::operator<<(pCVar6," ");
      pCVar6 = zsummer::log4z::CStringStream::operator<<(pCVar6," ) : ");
      iVar5 = 0x21c;
    }
  }
  else {
    pCVar6 = &ss_2;
    iVar5 = uv_ip4_addr(*(undefined8 *)((long)pvVar2 + 0x598),*(undefined4 *)((long)pvVar2 + 0x5b8),
                        pCVar6);
    if (iVar5 == 0) goto LAB_00117f86;
    ss.m_pBegin = pcVar1;
    ss.m_pEnd = pcVar3;
    ss.m_pCur = pcVar1;
    GetUVError_abi_cxx11_(&local_88,iVar5);
    zsummer::log4z::CStringStream::operator<<(&ss,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    pCVar6 = zsummer::log4z::CStringStream::operator<<(&ss," ( ");
    pCVar6 = zsummer::log4z::CStringStream::operator<<(pCVar6," ");
    pCVar6 = zsummer::log4z::CStringStream::operator<<(pCVar6," ) : ");
    iVar5 = 0x225;
  }
  zsummer::log4z::CStringStream::operator<<(pCVar6,iVar5);
  pIVar7 = zsummer::log4z::ILog4zManager::GetInstance();
  (*pIVar7->_vptr_ILog4zManager[8])(pIVar7,0,3,pcVar1);
  uv_close(*(undefined8 *)((long)pvVar2 + 8),0);
LAB_0011803a:
  uv_timer_stop(handle);
  lVar4 = *(long *)((long)pvVar2 + 0x590) * 2;
  *(long *)((long)pvVar2 + 0x590) = lVar4;
  uv_timer_start(handle,ReconnectTimer,lVar4);
  return;
}

Assistant:

void TCPClient::ReconnectTimer(uv_timer_t* handle)
{
    TCPClient* theclass = (TCPClient*)handle->data;
    if (!theclass->isreconnecting_) {
        return;
    }
    LOGI("start reconnect...\n");
    do {
        int iret = uv_tcp_init(&theclass->loop_, &theclass->client_handle_->tcphandle);
        if (iret) {
            LOGE(GetUVError(iret));
            break;
        }
        theclass->client_handle_->tcphandle.data = theclass->client_handle_;
        theclass->client_handle_->parent_server = theclass;
        struct sockaddr* pAddr;
        if (theclass->isIPv6_) {
            struct sockaddr_in6 bind_addr;
            int iret = uv_ip6_addr(theclass->connectip_.c_str(), theclass->connectport_, &bind_addr);
            if (iret) {
                LOGE(GetUVError(iret));
                uv_close((uv_handle_t*)&theclass->client_handle_->tcphandle, NULL);
                break;
            }
            pAddr = (struct sockaddr*)&bind_addr;
        } else {
            struct sockaddr_in bind_addr;
            int iret = uv_ip4_addr(theclass->connectip_.c_str(), theclass->connectport_, &bind_addr);
            if (iret) {
                LOGE(GetUVError(iret));
                uv_close((uv_handle_t*)&theclass->client_handle_->tcphandle, NULL);
                break;
            }
            pAddr = (struct sockaddr*)&bind_addr;
        }
        iret = uv_tcp_connect(&theclass->connect_req_, &theclass->client_handle_->tcphandle, (const sockaddr*)pAddr, AfterConnect);
        if (iret) {
            LOGE(GetUVError(iret));
            uv_close((uv_handle_t*)&theclass->client_handle_->tcphandle, NULL);
            break;
        }
        return;
    } while (0);
    //reconnect failure, restart timer to trigger reconnect.
    uv_timer_stop(handle);
    theclass->repeat_time_ *= 2;
    uv_timer_start(handle, TCPClient::ReconnectTimer, theclass->repeat_time_, theclass->repeat_time_);
}